

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkPrintStatsFull(Cba_Ntk_t *p,int fDistrib,int fVerbose)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *local_2f8;
  char *pTypeNames [90];
  uint local_1c;
  int i;
  int fVerbose_local;
  int fDistrib_local;
  Cba_Ntk_t *p_local;
  
  Cba_ManCreatePrimMap(&local_2f8);
  pcVar3 = Cba_NtkName(p);
  printf("%-20s : ",pcVar3);
  uVar1 = Cba_NtkPiNum(p);
  printf("PI = %4d  ",(ulong)uVar1);
  uVar1 = Cba_NtkPoNum(p);
  printf("PO = %4d  ",(ulong)uVar1);
  uVar1 = Cba_NtkBoxSeqNum(p);
  printf("FF = %4d  ",(ulong)uVar1);
  uVar1 = Cba_NtkObjNum(p);
  printf("Obj = %6d  ",(ulong)uVar1);
  iVar2 = Cba_NtkMemory(p);
  printf("Mem = %.3f MB",((double)iVar2 * 1.0) / 1048576.0);
  printf("\n");
  if (fDistrib == 0) {
    if (fVerbose != 0) {
      printf("Node type statistics:\n");
      for (local_1c = 1; (int)local_1c < 0x5a; local_1c = local_1c + 1) {
        if (p->pDesign->nObjs[(int)local_1c] != 0) {
          if ((p->pDesign->nAnds[0] == 0) || (p->pDesign->nAnds[(int)local_1c] == 0)) {
            printf("%2d  :  %-8s  %6d\n",(ulong)local_1c,pTypeNames[(long)(int)local_1c + -1],
                   (ulong)(uint)p->pDesign->nObjs[(int)local_1c]);
          }
          else {
            printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                   ((double)p->pDesign->nAnds[(int)local_1c] * 100.0) / (double)p->pDesign->nAnds[0]
                   ,(ulong)local_1c,pTypeNames[(long)(int)local_1c + -1],
                   (ulong)(uint)p->pDesign->nObjs[(int)local_1c]);
          }
        }
      }
    }
  }
  else {
    Cba_NtkPrintDistrib(p,fVerbose);
  }
  return;
}

Assistant:

void Cba_NtkPrintStatsFull( Cba_Ntk_t * p, int fDistrib, int fVerbose )
{
    int i;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "%-20s : ",        Cba_NtkName(p) );
    printf( "PI = %4d  ",      Cba_NtkPiNum(p) );
    printf( "PO = %4d  ",      Cba_NtkPoNum(p) );
    printf( "FF = %4d  ",      Cba_NtkBoxSeqNum(p) );
    printf( "Obj = %6d  ",     Cba_NtkObjNum(p) );
    printf( "Mem = %.3f MB",   1.0*Cba_NtkMemory(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Cba_NtkPrintDistrib( p, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < CBA_BOX_LAST; i++ )
    {
        if ( !p->pDesign->nObjs[i] )
            continue;
        if ( p->pDesign->nAnds[0] && p->pDesign->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, pTypeNames[i], p->pDesign->nObjs[i], 100.0*p->pDesign->nAnds[i]/p->pDesign->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, pTypeNames[i], p->pDesign->nObjs[i] );
    }
}